

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.cc
# Opt level: O0

bool __thiscall anon_unknown.dwarf_39db::TlbExportVisitor::visit_(TlbExportVisitor *this,Enum *type)

{
  bool bVar1;
  ostream *poVar2;
  pointer ppVar3;
  TlbExportVisitor local_d0 [32];
  _Self local_b0;
  _Base_ptr local_a8;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  local_a0;
  const_iterator it;
  Indent indenter;
  string local_40 [32];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *local_20;
  ValueMap *values;
  Enum *type_local;
  TlbExportVisitor *this_local;
  
  values = (ValueMap *)type;
  type_local = (Enum *)this;
  local_20 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              *)Typelib::Enum::values_abi_cxx11_();
  poVar2 = std::operator<<(this->m_stream,"<enum name=\"");
  Typelib::Type::getName_abi_cxx11_();
  poVar2 = std::operator<<(poVar2,local_40);
  poVar2 = std::operator<<(poVar2,"\" ");
  (anonymous_namespace)::TlbExportVisitor::emitSourceID_abi_cxx11_
            ((TlbExportVisitor *)&indenter.field_0x20);
  poVar2 = std::operator<<(poVar2,(string *)&indenter.field_0x20);
  std::operator<<(poVar2,">\n");
  std::__cxx11::string::~string((string *)&indenter.field_0x20);
  std::__cxx11::string::~string(local_40);
  Indent::Indent((Indent *)&it,&this->m_indent);
  std::
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  ::_Rb_tree_const_iterator(&local_a0);
  local_a8 = (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::begin(local_20);
  local_a0._M_node = local_a8;
  while( true ) {
    local_b0._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
         ::end(local_20);
    bVar1 = std::operator!=(&local_a0,&local_b0);
    if (!bVar1) break;
    poVar2 = std::operator<<(this->m_stream,(string *)&this->m_indent);
    poVar2 = std::operator<<(poVar2,"<value symbol=\"");
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
             ::operator->(&local_a0);
    poVar2 = std::operator<<(poVar2,(string *)ppVar3);
    poVar2 = std::operator<<(poVar2,"\" value=\"");
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
             ::operator->(&local_a0);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,ppVar3->second);
    std::operator<<(poVar2,"\"/>\n");
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
    ::operator++(&local_a0);
  }
  Indent::~Indent((Indent *)&it);
  poVar2 = std::operator<<(this->m_stream,(string *)&this->m_indent);
  (anonymous_namespace)::TlbExportVisitor::emitMetaData_abi_cxx11_(local_d0,(Type *)this);
  poVar2 = std::operator<<(poVar2,(string *)local_d0);
  std::operator<<(poVar2,"\n");
  std::__cxx11::string::~string((string *)local_d0);
  poVar2 = std::operator<<(this->m_stream,(string *)&this->m_indent);
  std::operator<<(poVar2,"</enum>");
  return true;
}

Assistant:

bool TlbExportVisitor::visit_ (Enum const& type)
    {
        Enum::ValueMap const& values = type.values();
        m_stream << "<enum name=\"" << type.getName() << "\" " << emitSourceID() << ">\n";
        { Indent indenter(m_indent);
            Enum::ValueMap::const_iterator it;
            for (it = values.begin(); it != values.end(); ++it)
                m_stream << m_indent << "<value symbol=\"" << it->first << "\" value=\"" << it->second << "\"/>\n";
        }
        m_stream << m_indent << emitMetaData(type) << "\n";
        m_stream << m_indent << "</enum>";

        return true;
    }